

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::FlushBackgroundPages
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this)

{
  size_t *psVar1;
  uint pageCount;
  undefined4 *puVar2;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment;
  HANDLE pVVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  DWORD DVar7;
  FreePageEntry *address;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
  *fromSegmentList;
  HANDLE pVVar8;
  ThreadContextId pvVar9;
  BackgroundPageQueue *this_00;
  uint uVar10;
  ulong uVar11;
  undefined8 *in_FS_OFFSET;
  
  iVar6 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar6 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x732,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar5) goto LAB_0025cb03;
    *puVar2 = 0;
  }
  this_00 = this->backgroundPageQueue;
  if (this_00 == (BackgroundPageQueue *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x733,"(backgroundPageQueue)","backgroundPageQueue");
    if (!bVar5) {
LAB_0025cb03:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
    this_00 = this->backgroundPageQueue;
  }
  address = BackgroundPageQueue::PopFreePageEntry(this_00);
  if (address == (FreePageEntry *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    do {
      segment = address->segment;
      pageCount = address->pageCount;
      fromSegmentList = GetSegmentList(this,segment);
      if (fromSegmentList ==
          (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
          0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x745,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
        if (!bVar5) goto LAB_0025cb03;
        *puVar2 = 0;
      }
      pVVar3 = this->processHandle;
      pVVar8 = GetCurrentProcess();
      if (pVVar3 != pVVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x747,"(this->processHandle == GetCurrentProcess())",
                           "this->processHandle == GetCurrentProcess()");
        if (!bVar5) goto LAB_0025cb03;
        *puVar2 = 0;
      }
      address->Next = (FreePageEntry *)0x0;
      address->segment = (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0;
      *(undefined8 *)&address->pageCount = 0;
      PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::ReleasePages
                (segment,address,pageCount);
      uVar10 = uVar10 + pageCount;
      TransferSegment(this,segment,fromSegmentList);
      address = BackgroundPageQueue::PopFreePageEntry(this->backgroundPageQueue);
    } while (address != (FreePageEntry *)0x0);
  }
  uVar11 = (ulong)uVar10;
  SubUsedBytes(this,uVar11 << 0xc);
  if (this->memoryData != (PageMemoryData *)0x0) {
    psVar1 = &this->memoryData->releasePageCount;
    *psVar1 = *psVar1 + uVar11;
  }
  bVar5 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
  if ((bVar5) && (this->pageAllocatorFlagTable->Verbose == true)) {
    pvVar9 = JsUtil::ExternalApi::GetCurrentThreadContextId();
    DVar7 = GetCurrentThreadId();
    Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar9,(ulong)DVar7,this);
    if (this->debugName != (char16 *)0x0) {
      Output::Print(L"[%s] ");
    }
    Output::Print(L"New free pages: %d\n",uVar11);
    Output::Print(L"\n");
    Output::Flush();
  }
  UpdateMinFreePageCount(this);
  this->freePageCount = this->freePageCount + uVar11;
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::FlushBackgroundPages()
{
    Assert(!this->HasMultiThreadAccess());
    Assert(backgroundPageQueue);

    // We can have additional pages queued up to be zeroed out here
    // and that's okay since they'll eventually be zeroed out before being flushed

    uint newFreePages = 0;

    while (true)
    {
        FreePageEntry * freePageEntry = backgroundPageQueue->PopFreePageEntry();
        if (freePageEntry == nullptr)
        {
            break;
        }
        TPageSegment * segment = freePageEntry->segment;
        uint pageCount = freePageEntry->pageCount;

        DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
        Assert(fromSegmentList != nullptr);

        Assert(this->processHandle == GetCurrentProcess());
        memset(freePageEntry, 0, sizeof(FreePageEntry));

        segment->ReleasePages(freePageEntry, pageCount);
        newFreePages += pageCount;

        TransferSegment(segment, fromSegmentList);
    }

    LogFreePages(newFreePages);

    PAGE_ALLOC_VERBOSE_TRACE(_u("New free pages: %d\n"), newFreePages);
    this->AddFreePageCount(newFreePages);
}